

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

void TTD::JsSupport::WriteCodeToFile
               (ThreadContext *threadContext,bool fromEvent,uint32 bodyId,bool isUtf8Source,
               byte *sourceBuffer,uint32 length)

{
  ThreadContextTTD *pTVar1;
  TTDOpenResourceStreamCallback p_Var2;
  size_t sVar3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uStack_b8;
  bool ok;
  size_t writtenCount;
  size_t sStack_a8;
  bool okBOC_1;
  size_t byteOrderCount_1;
  byte byteOrderArray_1 [2];
  size_t sStack_98;
  bool okBOC;
  size_t byteOrderCount;
  JsTTDStreamHandle pvStack_88;
  byte byteOrderArray [3];
  JsTTDStreamHandle srcStream;
  TTDataIOInfo *iofp;
  char asciiResourceName [64];
  uint32 length_local;
  byte *sourceBuffer_local;
  bool isUtf8Source_local;
  uint32 bodyId_local;
  bool fromEvent_local;
  ThreadContext *threadContext_local;
  
  pcVar6 = "";
  if (fromEvent) {
    pcVar6 = "_ld";
  }
  sprintf_s((char *)&iofp,0x40,"src%s_%I32u.js",pcVar6,(ulong)bodyId);
  pTVar1 = threadContext->TTDContext;
  p_Var2 = (pTVar1->TTDataIOInfo).pfOpenResourceStream;
  sVar3 = (pTVar1->TTDataIOInfo).ActiveTTUriLength;
  pcVar6 = (pTVar1->TTDataIOInfo).ActiveTTUri;
  sVar5 = strlen((char *)&iofp);
  pvStack_88 = (*p_Var2)(sVar3,pcVar6,sVar5,(char *)&iofp,false,true);
  if (pvStack_88 == (JsTTDStreamHandle)0x0) {
    TTDAbort_unrecoverable_error("Failed to open code resource stream for writing.");
  }
  if (isUtf8Source) {
    byteOrderCount._5_2_ = 0xbbef;
    byteOrderCount._7_1_ = 0xbf;
    sStack_98 = 0;
    byteOrderCount_1._7_1_ =
         (*(pTVar1->TTDataIOInfo).pfWriteBytesToStream)
                   (pvStack_88,(byte *)((long)&byteOrderCount + 5),3,&stack0xffffffffffffff68);
    if ((!(bool)byteOrderCount_1._7_1_) || (sStack_98 != 3)) {
      TTDAbort_unrecoverable_error("Write Failed!!!");
    }
  }
  else {
    byteOrderCount_1._5_2_ = 0xfeff;
    sStack_a8 = 0;
    writtenCount._7_1_ =
         (*(pTVar1->TTDataIOInfo).pfWriteBytesToStream)
                   (pvStack_88,(byte *)((long)&byteOrderCount_1 + 5),2,&stack0xffffffffffffff58);
    if ((!(bool)writtenCount._7_1_) || (sStack_a8 != 2)) {
      TTDAbort_unrecoverable_error("Write Failed!!!");
    }
  }
  uStack_b8 = 0;
  bVar4 = (*(pTVar1->TTDataIOInfo).pfWriteBytesToStream)
                    (pvStack_88,sourceBuffer,(size_t)length,&stack0xffffffffffffff48);
  if ((bVar4) && (uStack_b8 == length)) {
    (*(pTVar1->TTDataIOInfo).pfFlushAndCloseStream)(pvStack_88,false,true);
    return;
  }
  TTDAbort_unrecoverable_error("Write Failed!!!");
}

Assistant:

void WriteCodeToFile(ThreadContext* threadContext, bool fromEvent, uint32 bodyId, bool isUtf8Source, byte* sourceBuffer, uint32 length)
        {
            char asciiResourceName[64];
            sprintf_s(asciiResourceName, 64, "src%s_%I32u.js", (fromEvent ? "_ld" : ""), bodyId);

            TTDataIOInfo& iofp = threadContext->TTDContext->TTDataIOInfo;
            JsTTDStreamHandle srcStream = iofp.pfOpenResourceStream(iofp.ActiveTTUriLength, iofp.ActiveTTUri, strlen(asciiResourceName), asciiResourceName, false, true);
            TTDAssert(srcStream != nullptr, "Failed to open code resource stream for writing.");

            if(isUtf8Source)
            {
                byte byteOrderArray[3] = { 0xEF, 0xBB, 0xBF };
                size_t byteOrderCount = 0;
                bool okBOC = iofp.pfWriteBytesToStream(srcStream, byteOrderArray, _countof(byteOrderArray), &byteOrderCount);
                TTDAssert(okBOC && byteOrderCount == _countof(byteOrderArray), "Write Failed!!!");
            }
            else
            {
                byte byteOrderArray[2] = { 0xFF, 0xFE };
                size_t byteOrderCount = 0;
                bool okBOC = iofp.pfWriteBytesToStream(srcStream, byteOrderArray, _countof(byteOrderArray), &byteOrderCount);
                TTDAssert(okBOC && byteOrderCount == _countof(byteOrderArray), "Write Failed!!!");
            }

            size_t writtenCount = 0;
            bool ok = iofp.pfWriteBytesToStream(srcStream, sourceBuffer, length, &writtenCount);
            TTDAssert(ok && writtenCount == length, "Write Failed!!!");

            iofp.pfFlushAndCloseStream(srcStream, false, true);
        }